

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall
flatbuffers::ts::TsGenerator::GenStructArgs
          (TsGenerator *this,import_set *imports,StructDef *struct_def,string *arguments,
          string *nameprefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *owner;
  StructDef *struct_def_00;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  ulong *puVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer ppFVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  TsGenerator *local_b0;
  import_set *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  StructDef *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppFVar9 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar9 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_f8.field_2;
    local_b8 = arguments;
    local_b0 = this;
    local_a8 = imports;
    local_a0 = nameprefix;
    local_58 = struct_def;
    do {
      paVar10 = &local_d8.field_2;
      owner = *ppFVar9;
      if (((owner->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (owner->value).type.struct_def, struct_def_00->fixed == true)) {
        std::operator+(&local_d8,local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner);
        puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        psVar4 = puVar2 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_f8.field_2._M_allocated_capacity = *psVar4;
          local_f8.field_2._8_8_ = puVar2[3];
          local_f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar4;
          local_f8._M_dataplus._M_p = (pointer)*puVar2;
        }
        local_f8._M_string_length = puVar2[1];
        *puVar2 = psVar4;
        puVar2[1] = 0;
        *(undefined1 *)(puVar2 + 2) = 0;
        GenStructArgs(local_b0,local_a8,struct_def_00,local_b8,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        uVar7 = local_d8.field_2._M_allocated_capacity;
        _Var8._M_p = local_d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_0024c673:
          operator_delete(_Var8._M_p,uVar7 + 1);
        }
      }
      else {
        std::operator+(&local_50,", ",local_a0);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,
                                    (ulong)(owner->super_Definition).name._M_dataplus._M_p);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_68 = *plVar5;
          lStack_60 = plVar3[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar5;
          local_78 = (long *)*plVar3;
        }
        local_70 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_d8.field_2._M_allocated_capacity = *puVar6;
          local_d8.field_2._8_8_ = plVar3[3];
          local_d8._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *puVar6;
          local_d8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_d8._M_string_length = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        GenTypeName(&local_98,local_b0,local_a8,&owner->super_Definition,&(owner->value).type,true,
                    owner->presence == kOptional);
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar10) {
          uVar7 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_98._M_string_length + local_d8._M_string_length) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar7 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_98._M_string_length + local_d8._M_string_length)
          goto LAB_0024c50d;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_98,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
        }
        else {
LAB_0024c50d:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
        }
        psVar4 = puVar2 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_f8.field_2._M_allocated_capacity = *psVar4;
          local_f8.field_2._8_8_ = puVar2[3];
          local_f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar4;
          local_f8._M_dataplus._M_p = (pointer)*puVar2;
        }
        local_f8._M_string_length = puVar2[1];
        *puVar2 = psVar4;
        puVar2[1] = 0;
        *(undefined1 *)psVar4 = 0;
        std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar10) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        uVar7 = local_50.field_2._M_allocated_capacity;
        _Var8._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0024c673;
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructArgs(import_set &imports, const StructDef &struct_def,
                     std::string *arguments, const std::string &nameprefix) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(imports, *field.value.type.struct_def, arguments,
                      nameprefix + field.name + "_");
      } else {
        *arguments += ", " + nameprefix + field.name + ": " +
                      GenTypeName(imports, field, field.value.type, true,
                                  field.IsOptional());
      }
    }
  }